

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-create.cc
# Opt level: O1

void __thiscall ImageProvider::~ImageProvider(ImageProvider *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__ImageProvider_0010cb08;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->stripes);
  pcVar2 = (this->filter)._M_dataplus._M_p;
  paVar1 = &(this->filter).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->color_space)._M_dataplus._M_p;
  paVar1 = &(this->color_space).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  QPDFObjectHandle::StreamDataProvider::~StreamDataProvider(&this->super_StreamDataProvider);
  return;
}

Assistant:

~ImageProvider() override = default;